

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int vm_builtin_dump(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxu32 nSize;
  jx9_value *pVal;
  char *pcVar1;
  char *pData;
  char *pcVar2;
  ulong uVar3;
  SyBlob local_68;
  json_private_data local_48;
  
  local_68.pAllocator = &pCtx->pVm->sAllocator;
  local_68.pBlob = (char *)0x0;
  local_68.nByte = 0;
  local_68.mByte = 0;
  local_68.nFlags = 0;
  if (0 < nArg) {
    uVar3 = 0;
    do {
      pVal = apArg[uVar3];
      local_68._16_8_ = local_68._16_8_ & 0xffffffff00000000;
      if ((local_68.nFlags & 4) != 0) {
        local_68.pBlob = (char *)0x0;
        local_68.nByte = 0;
        local_68.mByte = 0;
        local_68.nFlags = local_68.nFlags & 0xfffffffb;
      }
      pData = jx9MemObjTypeDump(pVal);
      pcVar2 = pData;
      if (*pData != '\0') {
        pcVar1 = pData + 2;
        do {
          pcVar2 = pcVar1;
          if (pcVar2[-1] == '\0') {
            pcVar2 = pcVar2 + -1;
            goto LAB_0012b138;
          }
          if (*pcVar2 == '\0') goto LAB_0012b138;
          if (pcVar2[1] == '\0') {
            pcVar2 = pcVar2 + 1;
            goto LAB_0012b138;
          }
          pcVar1 = pcVar2 + 4;
        } while (pcVar2[2] != '\0');
        pcVar2 = pcVar2 + 2;
      }
LAB_0012b138:
      SyBlobAppend(&local_68,pData,(int)pcVar2 - (int)pData);
      if ((pVal->iFlags & 0x20) == 0) {
        SyBlobAppend(&local_68,"(",1);
        if ((pVal->iFlags & 0x40U) == 0) {
          if ((pVal->iFlags & 1U) == 0) {
            MemObjStringValue(&local_68,pVal);
          }
          else {
            SyBlobFormat(&local_68,"%u \'",(ulong)(pVal->sBlob).nByte);
            nSize = (pVal->sBlob).nByte;
            if (nSize != 0) {
              SyBlobAppend(&local_68,(pVal->sBlob).pBlob,nSize);
            }
            SyBlobAppend(&local_68,"\'",1);
          }
        }
        else {
          SyBlobFormat(&local_68,"%u ",(ulong)*(uint *)((pVal->x).iVal + 0x2c));
          local_48.nRecCount = 0;
          local_48.isFirst = 1;
          local_48.iFlags = 0;
          local_48.pOut = &local_68;
          VmJsonEncode(pVal,&local_48);
        }
        SyBlobAppend(&local_68,")",1);
      }
      SyBlobAppend(&local_68,"\n",1);
      if (local_68.nByte != 0) {
        jx9_context_output(pCtx,(char *)local_68.pBlob,local_68.nByte);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)nArg);
    if (((local_68.nFlags & 6) == 0) && (local_68.mByte != 0)) {
      SyMemBackendFree(local_68.pAllocator,local_68.pBlob);
    }
  }
  return 0;
}

Assistant:

static int vm_builtin_dump(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyBlob sDump; /* Generated dump is stored here */
	int i;
	SyBlobInit(&sDump,&pCtx->pVm->sAllocator);
	/* Dump one or more expressions */
	for( i = 0 ; i < nArg ; i++ ){
		jx9_value *pObj = apArg[i];
		/* Reset the working buffer */
		SyBlobReset(&sDump);
		/* Dump the given expression */
		jx9MemObjDump(&sDump,pObj);
		/* Output */
		if( SyBlobLength(&sDump) > 0 ){
			jx9_context_output(pCtx, (const char *)SyBlobData(&sDump), (int)SyBlobLength(&sDump));
		}
	}
	/* Release the working buffer */
	SyBlobRelease(&sDump);
	return SXRET_OK;
}